

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDual.cpp
# Opt level: O2

void __thiscall HDual::iz_dvx_fwk(HDual *this)

{
  pointer piVar1;
  HModel *pHVar2;
  pointer pdVar3;
  ulong uVar4;
  int vr_n;
  long lVar5;
  ulong uVar6;
  
  piVar1 = (this->dvx_ix).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pHVar2 = this->model;
  for (lVar5 = 0; lVar5 < this->numTot; lVar5 = lVar5 + 1) {
    piVar1[lVar5] =
         (uint)((pHVar2->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar5] == 0);
  }
  pdVar3 = (this->dualRHS).workEdWt.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar6 = 0;
  uVar4 = (ulong)(uint)this->numRow;
  if (this->numRow < 1) {
    uVar4 = uVar6;
  }
  for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    pdVar3[uVar6] = 1.0;
  }
  this->n_dvx_it = 0;
  this->n_dvx_fwk = this->n_dvx_fwk + 1;
  this->nw_dvx_fwk = false;
  return;
}

Assistant:

void HDual::iz_dvx_fwk() {
//Initialise the Devex framework: reference set is all basic variables
	for (int vr_n = 0; vr_n < numTot; vr_n++) {
		if (model->getNonbasicFlag()[vr_n])
			//			Nonbasic variables not in reference set
			dvx_ix[vr_n] = dvx_not_in_R;
		else
			//			Basic variables in reference set
			dvx_ix[vr_n] = dvx_in_R;
	}
	for (int i = 0; i < numRow; i++)
		dualRHS.workEdWt[i] = 1.0;
	n_dvx_it = 0;
	n_dvx_fwk += 1;
	nw_dvx_fwk = false;
}